

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::writeJSON
          (QPDFObjectHandle *this,int json_version,Writer *p,bool dereference_indirect)

{
  element_type *peVar1;
  logic_error *this_00;
  undefined3 in_register_00000009;
  string local_38;
  QPDFObjGen local_18;
  
  if (((CONCAT31(in_register_00000009,dereference_indirect) == 0) &&
      (peVar1 = (this->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar1 != (element_type *)0x0)) && ((peVar1->og).obj != 0)) {
    (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      local_18.obj = 0;
      local_18.gen = 0;
    }
    else {
      local_18 = peVar1->og;
    }
    QPDFObjGen::unparse_abi_cxx11_(&local_38,&local_18,' ');
    (*p->p->_vptr_Pipeline[2])(p->p,local_38._M_dataplus._M_p,local_38._M_string_length);
    (*p->p->_vptr_Pipeline[2])(p->p," R\"",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if ((this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    ::qpdf::BaseHandle::write_json(&this->super_BaseHandle,json_version,p);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFObjectHandle::writeJSON(int json_version, JSON::Writer& p, bool dereference_indirect) const
{
    if (!dereference_indirect && isIndirect()) {
        p << "\"" << getObjGen().unparse(' ') << " R\"";
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        write_json(json_version, p);
    }
}